

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O0

Cnf_Dat_t * Cnf_DataReadFromFile(char *pFileName)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *__s;
  char *pcVar5;
  int *piVar6;
  uint local_74;
  FILE *pFile;
  char *pToken;
  char *pBuffer;
  Vec_Int_t *vLits;
  Vec_Int_t *vClas;
  Cnf_Dat_t *pCnf;
  int iLine;
  int Entry;
  int i;
  int nClas;
  int nVars;
  int Lit;
  int Var;
  int MaxLine;
  char *pFileName_local;
  
  Lit = 1000000;
  i = -1;
  Entry = -1;
  pCnf._0_4_ = 0;
  vClas = (Vec_Int_t *)0x0;
  vLits = (Vec_Int_t *)0x0;
  pBuffer = (char *)0x0;
  _Var = pFileName;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",_Var);
    return (Cnf_Dat_t *)0x0;
  }
  __s = (char *)malloc((long)Lit);
  do {
    do {
      while( true ) {
        do {
          pcVar5 = fgets(__s,Lit,__stream);
          if (pcVar5 == (char *)0x0) {
            iVar2 = Vec_IntSize(vLits);
            if (iVar2 != Entry) {
              uVar3 = Vec_IntSize(vLits);
              printf("Warning! The number of clauses (%d) is different from declaration (%d).\n",
                     (ulong)uVar3,(ulong)(uint)Entry);
            }
            pVVar1 = vLits;
            iVar2 = Vec_IntSize((Vec_Int_t *)pBuffer);
            Vec_IntPush(pVVar1,iVar2);
            vClas = (Vec_Int_t *)calloc(1,0x48);
            *(int *)&vClas->pArray = i;
            iVar2 = Vec_IntSize(vLits);
            vClas[1].nCap = iVar2 + -1;
            iVar2 = Vec_IntSize((Vec_Int_t *)pBuffer);
            *(int *)((long)&vClas->pArray + 4) = iVar2;
            iVar2 = Vec_IntSize(vLits);
            piVar6 = (int *)malloc((long)iVar2 << 3);
            vClas[1].pArray = piVar6;
            piVar6 = Vec_IntReleaseArray((Vec_Int_t *)pBuffer);
            *(int **)vClas[1].pArray = piVar6;
            for (iLine = 0; iVar2 = iLine, iVar4 = Vec_IntSize(vLits), iVar2 < iVar4;
                iLine = iLine + 1) {
              pCnf._4_4_ = Vec_IntEntry(vLits,iLine);
              *(long *)(vClas[1].pArray + (long)iLine * 2) =
                   *(long *)vClas[1].pArray + (long)pCnf._4_4_ * 4;
            }
            goto LAB_006aa3ef;
          }
          pCnf._0_4_ = (uint)pCnf + 1;
        } while (*__s == 'c');
        if (*__s != 'p') break;
        pcVar5 = strtok(__s + 1," \t");
        iVar2 = strcmp(pcVar5,"cnf");
        if (iVar2 != 0) {
          printf("Incorrect input file.\n");
          goto LAB_006aa3ef;
        }
        pcVar5 = strtok((char *)0x0," \t");
        i = atoi(pcVar5);
        pcVar5 = strtok((char *)0x0," \t");
        Entry = atoi(pcVar5);
        if ((i < 1) || (Entry < 1)) {
          printf("Incorrect parameters.\n");
          goto LAB_006aa3ef;
        }
        vLits = Vec_IntAlloc(Entry + 1);
        pBuffer = (char *)Vec_IntAlloc(Entry << 3);
      }
      pFile = (FILE *)strtok(__s," \t\r\n");
      pVVar1 = vLits;
    } while (pFile == (FILE *)0x0);
    iVar2 = Vec_IntSize((Vec_Int_t *)pBuffer);
    Vec_IntPush(pVVar1,iVar2);
    while ((pFile != (FILE *)0x0 && (nVars = atoi((char *)pFile), nVars != 0))) {
      if (nVars < 1) {
        local_74 = Abc_Var2Lit(-1 - nVars,1);
      }
      else {
        local_74 = Abc_Var2Lit(nVars + -1,0);
      }
      nClas = local_74;
      if (SBORROW4(local_74,i * 2) == (int)(local_74 + i * -2) < 0) {
        printf("Literal %d is out-of-bound for %d variables.\n",(ulong)local_74,(ulong)(uint)i);
        goto LAB_006aa3ef;
      }
      Vec_IntPush((Vec_Int_t *)pBuffer,local_74);
      pFile = (FILE *)strtok((char *)0x0," \t\r\n");
    }
  } while (nVars == 0);
  printf("There is no zero-terminator in line %d.\n",(ulong)(uint)pCnf);
LAB_006aa3ef:
  fclose(__stream);
  Vec_IntFreeP(&vLits);
  Vec_IntFreeP((Vec_Int_t **)&pBuffer);
  if (__s != (char *)0x0) {
    free(__s);
  }
  return (Cnf_Dat_t *)vClas;
}

Assistant:

Cnf_Dat_t * Cnf_DataReadFromFile( char * pFileName )
{
    int MaxLine = 1000000;
    int Var, Lit, nVars = -1, nClas = -1, i, Entry, iLine = 0;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vClas = NULL;
    Vec_Int_t * vLits = NULL;
    char * pBuffer, * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return NULL;
    }
    pBuffer = ABC_ALLOC( char, MaxLine );
    while ( fgets(pBuffer, MaxLine, pFile) != NULL )
    {
        iLine++;
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            pToken = strtok( pBuffer+1, " \t" );
            if ( strcmp(pToken, "cnf") )
            {
                printf( "Incorrect input file.\n" );
                goto finish;
            }
            pToken = strtok( NULL, " \t" );
            nVars = atoi( pToken );
            pToken = strtok( NULL, " \t" );
            nClas = atoi( pToken );
            if ( nVars <= 0 || nClas <= 0 )
            {
                printf( "Incorrect parameters.\n" );
                goto finish;
            }
            // temp storage
            vClas = Vec_IntAlloc( nClas+1 );
            vLits = Vec_IntAlloc( nClas*8 );
            continue;
        }
        pToken = strtok( pBuffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        while ( pToken )
        {
            Var = atoi( pToken );
            if ( Var == 0 )
                break;
            Lit = (Var > 0) ? Abc_Var2Lit(Var-1, 0) : Abc_Var2Lit(-Var-1, 1);
            if ( Lit >= 2*nVars )
            {
                printf( "Literal %d is out-of-bound for %d variables.\n", Lit, nVars );
                goto finish;
            }
            Vec_IntPush( vLits, Lit );
            pToken = strtok( NULL, " \t\r\n" );
        }
        if ( Var != 0 )
        {
            printf( "There is no zero-terminator in line %d.\n", iLine );
            goto finish;
        }
    }
    // finalize
    if ( Vec_IntSize(vClas) != nClas )
        printf( "Warning! The number of clauses (%d) is different from declaration (%d).\n", Vec_IntSize(vClas), nClas );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    // create
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVars;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
finish:
    fclose( pFile );
    Vec_IntFreeP( &vClas );
    Vec_IntFreeP( &vLits );
    ABC_FREE( pBuffer );
    return pCnf;
}